

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analysis.cpp
# Opt level: O3

void __thiscall Analysis::FlowAnalysis(Analysis *this)

{
  pointer pcVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  iterator iVar5;
  ostream *this_00;
  bool bVar6;
  singleParticleSpectra *psVar7;
  singleParticleSpectra **ipart;
  singleParticleSpectra **ppsVar8;
  _Alloc_hider _Var9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> spvn;
  ParameterReader paraRdr;
  singleParticleSpectra *local_1760;
  singleParticleSpectra **local_1758;
  iterator iStack_1750;
  singleParticleSpectra **local_1748;
  ParameterReader local_1738;
  ostream *local_1708;
  int local_16fc;
  ulong local_16f8;
  shared_ptr<particleSamples> local_16f0;
  shared_ptr<RandomUtil::Random> local_16e0;
  shared_ptr<RandomUtil::Random> local_16d0;
  shared_ptr<RandomUtil::Random> local_16c0;
  shared_ptr<RandomUtil::Random> local_16b0;
  shared_ptr<RandomUtil::Random> local_16a0;
  shared_ptr<RandomUtil::Random> local_1690;
  shared_ptr<RandomUtil::Random> local_1680;
  shared_ptr<RandomUtil::Random> local_1670;
  shared_ptr<RandomUtil::Random> local_1660;
  shared_ptr<RandomUtil::Random> local_1650;
  shared_ptr<RandomUtil::Random> local_1640;
  shared_ptr<RandomUtil::Random> local_1630;
  shared_ptr<RandomUtil::Random> local_1620;
  shared_ptr<RandomUtil::Random> local_1610;
  shared_ptr<RandomUtil::Random> local_1600;
  shared_ptr<RandomUtil::Random> local_15f0;
  shared_ptr<RandomUtil::Random> local_15e0;
  shared_ptr<RandomUtil::Random> local_15d0;
  shared_ptr<RandomUtil::Random> local_15c0;
  shared_ptr<RandomUtil::Random> local_15b0;
  shared_ptr<RandomUtil::Random> local_15a0;
  shared_ptr<RandomUtil::Random> local_1590;
  shared_ptr<RandomUtil::Random> local_1580;
  shared_ptr<RandomUtil::Random> local_1570;
  shared_ptr<RandomUtil::Random> local_1560;
  shared_ptr<RandomUtil::Random> local_1550;
  shared_ptr<RandomUtil::Random> local_1540;
  shared_ptr<RandomUtil::Random> local_1530;
  shared_ptr<RandomUtil::Random> local_1520;
  shared_ptr<RandomUtil::Random> local_1510;
  shared_ptr<RandomUtil::Random> local_1500;
  shared_ptr<RandomUtil::Random> local_14f0;
  shared_ptr<RandomUtil::Random> local_14e0;
  shared_ptr<RandomUtil::Random> local_14d0;
  shared_ptr<RandomUtil::Random> local_14c0;
  shared_ptr<RandomUtil::Random> local_14b0;
  shared_ptr<RandomUtil::Random> local_14a0;
  shared_ptr<RandomUtil::Random> local_1490;
  shared_ptr<RandomUtil::Random> local_1480;
  shared_ptr<RandomUtil::Random> local_1470;
  shared_ptr<RandomUtil::Random> local_1460;
  shared_ptr<RandomUtil::Random> local_1450;
  shared_ptr<RandomUtil::Random> local_1440;
  string local_1430;
  string local_1410;
  string local_13f0;
  string local_13d0;
  string local_13b0;
  string local_1390;
  string local_1370;
  string local_1350;
  string local_1330;
  string local_1310;
  string local_12f0;
  string local_12d0;
  string local_12b0;
  string local_1290;
  string local_1270;
  string local_1250;
  string local_1230;
  string local_1210;
  string local_11f0;
  string local_11d0;
  string local_11b0;
  string local_1190;
  string local_1170;
  string local_1150;
  string local_1130;
  string local_1110;
  string local_10f0;
  string local_10d0;
  string local_10b0;
  string local_1090;
  string local_1070;
  string local_1050;
  string local_1030;
  string local_1010;
  string local_ff0;
  string local_fd0;
  string local_fb0;
  string local_f90;
  string local_f70;
  string local_f50;
  string local_f30;
  string local_f10;
  string local_ef0;
  string local_ed0;
  string local_eb0;
  string local_e90;
  string local_e70;
  string local_e50;
  string local_e30;
  string local_e10;
  string local_df0;
  string local_dd0;
  string local_db0;
  string local_d90;
  string local_d70;
  string local_d50;
  string local_d30;
  string local_d10;
  string local_cf0;
  string local_cd0;
  string local_cb0;
  string local_c90;
  string local_c70;
  string local_c50;
  string local_c30;
  string local_c10;
  string local_bf0;
  string local_bd0;
  string local_bb0;
  string local_b90;
  string local_b70;
  string local_b50;
  string local_b30;
  string local_b10;
  string local_af0;
  string local_ad0;
  string local_ab0;
  string local_a90;
  string local_a70;
  string local_a50;
  string local_a30;
  string local_a10;
  string local_9f0;
  string local_9d0;
  string local_9b0;
  string local_990;
  string local_970;
  string local_950;
  string local_930;
  string local_910;
  string local_8f0;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1738.names,&(this->paraRdr_).names);
  std::vector<double,_std::allocator<double>_>::vector(&local_1738.values,&(this->paraRdr_).values);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"compute_correlation","");
  dVar2 = ParameterReader::getVal(&local_1738,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((int)dVar2 == 1) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"compute_correlation","");
    ParameterReader::setVal(&local_1738,&local_70,0.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"flag_charge_dependence","");
  dVar3 = ParameterReader::getVal(&local_1738,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((int)dVar3 == 1) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"flag_charge_dependence","")
    ;
    ParameterReader::setVal(&local_1738,&local_b0,0.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  local_1758 = (singleParticleSpectra **)0x0;
  iStack_1750._M_current = (singleParticleSpectra **)0x0;
  local_1748 = (singleParticleSpectra **)0x0;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"particle_monval","");
  ParameterReader::setVal(&local_1738,&local_d0,99999.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"rap_type","");
  ParameterReader::setVal(&local_1738,&local_f0,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"rapidity_distribution","");
  ParameterReader::setVal(&local_1738,&local_110,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"vn_rapidity_dis_pT_min","");
  ParameterReader::setVal(&local_1738,&local_130,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"vn_rapidity_dis_pT_max","");
  ParameterReader::setVal(&local_1738,&local_150,4.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_170,"rapidityPTDistributionFlag","");
  ParameterReader::setVal(&local_1738,&local_170,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_1440.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_1440.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_1440.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1440.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1440.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1440.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1440.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_190,&local_1440);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_1440.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1440.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"particle_monval","");
  ParameterReader::setVal(&local_1738,&local_1b0,9999.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"rap_type","");
  ParameterReader::setVal(&local_1738,&local_1d0,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"rapidity_distribution","");
  ParameterReader::setVal(&local_1738,&local_1f0,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,"rapidityPTDistributionFlag","");
  ParameterReader::setVal(&local_1738,&local_210,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"rap_min","");
  ParameterReader::setVal(&local_1738,&local_230,-0.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"rap_max","");
  ParameterReader::setVal(&local_1738,&local_250,0.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"vn_rapidity_dis_pT_min","");
  ParameterReader::setVal(&local_1738,&local_270,0.15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"vn_rapidity_dis_pT_max","");
  ParameterReader::setVal(&local_1738,&local_290,2.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b0,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_1450.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_1450.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_1450.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1450.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1450.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1450.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1450.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_2b0,&local_1450);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_1450.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1450.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"vn_rapidity_dis_pT_min","");
  ParameterReader::setVal(&local_1738,&local_2d0,0.2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"vn_rapidity_dis_pT_max","");
  ParameterReader::setVal(&local_1738,&local_2f0,3.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_310,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_1460.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_1460.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_1460.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1460.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1460.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1460.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1460.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_310,&local_1460);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_1460.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1460.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p);
  }
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"rap_min","");
  ParameterReader::setVal(&local_1738,&local_330,-1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p);
  }
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"rap_max","");
  ParameterReader::setVal(&local_1738,&local_350,-0.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_370,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_1470.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_1470.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_1470.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1470.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1470.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1470.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1470.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_370,&local_1470);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_1470.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1470.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p);
  }
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"rap_min","");
  ParameterReader::setVal(&local_1738,&local_390,0.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"rap_max","");
  ParameterReader::setVal(&local_1738,&local_3b0,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3d0,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_1480.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_1480.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_1480.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1480.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1480.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1480.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1480.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_3d0,&local_1480);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_1480.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1480.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"rap_min","");
  ParameterReader::setVal(&local_1738,&local_3f0,-1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"rap_max","");
  ParameterReader::setVal(&local_1738,&local_410,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_430,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_1490.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_1490.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_1490.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1490.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1490.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1490.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1490.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_430,&local_1490);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_1490.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1490.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"rap_min","");
  ParameterReader::setVal(&local_1738,&local_450,-0.8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p);
  }
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"rap_max","");
  ParameterReader::setVal(&local_1738,&local_470,0.8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_490,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_14a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_14a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_14a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_14a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_14a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_14a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_14a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_490,&local_14a0);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_14a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_14a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p);
  }
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"vn_rapidity_dis_pT_min","");
  ParameterReader::setVal(&local_1738,&local_4b0,0.4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p);
  }
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"vn_rapidity_dis_pT_max","");
  ParameterReader::setVal(&local_1738,&local_4d0,4.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p);
  }
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"rap_min","");
  ParameterReader::setVal(&local_1738,&local_4f0,-1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p);
  }
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"rap_max","");
  ParameterReader::setVal(&local_1738,&local_510,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_530,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_14b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_14b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_14b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_14b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_14b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_14b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_14b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_530,&local_14b0);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_14b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_14b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p);
  }
  local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"vn_rapidity_dis_pT_min","");
  ParameterReader::setVal(&local_1738,&local_550,0.3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p);
  }
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_570,"vn_rapidity_dis_pT_max","");
  ParameterReader::setVal(&local_1738,&local_570,3.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p);
  }
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,"rap_min","");
  ParameterReader::setVal(&local_1738,&local_590,-2.4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p);
  }
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"rap_max","");
  ParameterReader::setVal(&local_1738,&local_5b0,2.4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5d0,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_14c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_14c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_14c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_14c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_14c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_14c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_14c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_5d0,&local_14c0);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_14c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_14c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
    operator_delete(local_5d0._M_dataplus._M_p);
  }
  local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f0,"vn_rapidity_dis_pT_min","");
  ParameterReader::setVal(&local_1738,&local_5f0,0.4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
    operator_delete(local_5f0._M_dataplus._M_p);
  }
  local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_610,"vn_rapidity_dis_pT_max","");
  ParameterReader::setVal(&local_1738,&local_610,2.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._M_dataplus._M_p != &local_610.field_2) {
    operator_delete(local_610._M_dataplus._M_p);
  }
  local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"rap_min","");
  ParameterReader::setVal(&local_1738,&local_630,-2.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_630._M_dataplus._M_p != &local_630.field_2) {
    operator_delete(local_630._M_dataplus._M_p);
  }
  local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_650,"rap_max","");
  ParameterReader::setVal(&local_1738,&local_650,2.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650._M_dataplus._M_p != &local_650.field_2) {
    operator_delete(local_650._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_670,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_14d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_14d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_14d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_14d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_14d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_14d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_14d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_670,&local_14d0);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_14d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_14d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p != &local_670.field_2) {
    operator_delete(local_670._M_dataplus._M_p);
  }
  local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_690,"vn_rapidity_dis_pT_min","");
  ParameterReader::setVal(&local_1738,&local_690,0.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690._M_dataplus._M_p != &local_690.field_2) {
    operator_delete(local_690._M_dataplus._M_p);
  }
  local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b0,"vn_rapidity_dis_pT_max","");
  ParameterReader::setVal(&local_1738,&local_6b0,5.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
    operator_delete(local_6b0._M_dataplus._M_p);
  }
  local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d0,"rap_min","");
  ParameterReader::setVal(&local_1738,&local_6d0,-2.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
    operator_delete(local_6d0._M_dataplus._M_p);
  }
  local_6f0._M_dataplus._M_p = (pointer)&local_6f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f0,"rap_max","");
  ParameterReader::setVal(&local_1738,&local_6f0,2.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
    operator_delete(local_6f0._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_710._M_dataplus._M_p = (pointer)&local_710.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_710,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_14e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_14e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_14e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_14e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_14e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_14e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_14e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_710,&local_14e0);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_14e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_14e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_710._M_dataplus._M_p != &local_710.field_2) {
    operator_delete(local_710._M_dataplus._M_p);
  }
  local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_730,"rap_min","");
  ParameterReader::setVal(&local_1738,&local_730,0.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730._M_dataplus._M_p != &local_730.field_2) {
    operator_delete(local_730._M_dataplus._M_p);
  }
  local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_750,"rap_max","");
  ParameterReader::setVal(&local_1738,&local_750,2.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._M_dataplus._M_p != &local_750.field_2) {
    operator_delete(local_750._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_770,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_14f0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_14f0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_14f0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_14f0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_14f0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_14f0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_14f0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_770,&local_14f0);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_14f0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_14f0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_770._M_dataplus._M_p != &local_770.field_2) {
    operator_delete(local_770._M_dataplus._M_p);
  }
  local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"rap_min","");
  ParameterReader::setVal(&local_1738,&local_790,-2.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790._M_dataplus._M_p != &local_790.field_2) {
    operator_delete(local_790._M_dataplus._M_p);
  }
  local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"rap_max","");
  ParameterReader::setVal(&local_1738,&local_7b0,-0.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
    operator_delete(local_7b0._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7d0,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_1500.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_1500.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_1500.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1500.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1500.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1500.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1500.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_7d0,&local_1500);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_1500.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1500.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
    operator_delete(local_7d0._M_dataplus._M_p);
  }
  local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"rap_min","");
  ParameterReader::setVal(&local_1738,&local_7f0,-4.9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
    operator_delete(local_7f0._M_dataplus._M_p);
  }
  local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_810,"rap_max","");
  ParameterReader::setVal(&local_1738,&local_810,-3.1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810._M_dataplus._M_p != &local_810.field_2) {
    operator_delete(local_810._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_830._M_dataplus._M_p = (pointer)&local_830.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_830,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_1510.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_1510.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_1510.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1510.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1510.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1510.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1510.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_830,&local_1510);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_1510.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1510.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830._M_dataplus._M_p != &local_830.field_2) {
    operator_delete(local_830._M_dataplus._M_p);
  }
  local_850._M_dataplus._M_p = (pointer)&local_850.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_850,"rap_min","");
  ParameterReader::setVal(&local_1738,&local_850,3.1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_850._M_dataplus._M_p != &local_850.field_2) {
    operator_delete(local_850._M_dataplus._M_p);
  }
  local_870._M_dataplus._M_p = (pointer)&local_870.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_870,"rap_max","");
  ParameterReader::setVal(&local_1738,&local_870,4.9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_870._M_dataplus._M_p != &local_870.field_2) {
    operator_delete(local_870._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_890._M_dataplus._M_p = (pointer)&local_890.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_890,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_1520.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_1520.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_1520.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1520.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1520.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1520.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1520.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_890,&local_1520);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_1520.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1520.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_890._M_dataplus._M_p != &local_890.field_2) {
    operator_delete(local_890._M_dataplus._M_p);
  }
  local_8b0._M_dataplus._M_p = (pointer)&local_8b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b0,"vn_rapidity_dis_pT_min","");
  ParameterReader::setVal(&local_1738,&local_8b0,0.2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b0._M_dataplus._M_p != &local_8b0.field_2) {
    operator_delete(local_8b0._M_dataplus._M_p);
  }
  local_8d0._M_dataplus._M_p = (pointer)&local_8d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"vn_rapidity_dis_pT_max","");
  ParameterReader::setVal(&local_1738,&local_8d0,3.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != &local_8d0.field_2) {
    operator_delete(local_8d0._M_dataplus._M_p);
  }
  local_8f0._M_dataplus._M_p = (pointer)&local_8f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8f0,"rap_min","");
  ParameterReader::setVal(&local_1738,&local_8f0,-5.1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
    operator_delete(local_8f0._M_dataplus._M_p);
  }
  local_910._M_dataplus._M_p = (pointer)&local_910.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_910,"rap_max","");
  ParameterReader::setVal(&local_1738,&local_910,-2.8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910._M_dataplus._M_p != &local_910.field_2) {
    operator_delete(local_910._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_930._M_dataplus._M_p = (pointer)&local_930.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_930,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_1530.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_1530.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_1530.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1530.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1530.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1530.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1530.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_930,&local_1530);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_1530.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1530.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_930._M_dataplus._M_p != &local_930.field_2) {
    operator_delete(local_930._M_dataplus._M_p);
  }
  local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_950,"rap_min","");
  ParameterReader::setVal(&local_1738,&local_950,2.8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_950._M_dataplus._M_p != &local_950.field_2) {
    operator_delete(local_950._M_dataplus._M_p);
  }
  local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_970,"rap_max","");
  ParameterReader::setVal(&local_1738,&local_970,5.1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970._M_dataplus._M_p != &local_970.field_2) {
    operator_delete(local_970._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_990._M_dataplus._M_p = (pointer)&local_990.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_990,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_1540.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_1540.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_1540.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1540.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1540.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1540.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1540.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_990,&local_1540);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_1540.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1540.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_990._M_dataplus._M_p != &local_990.field_2) {
    operator_delete(local_990._M_dataplus._M_p);
  }
  local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9b0,"rap_min","");
  ParameterReader::setVal(&local_1738,&local_9b0,1.7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
    operator_delete(local_9b0._M_dataplus._M_p);
  }
  local_9d0._M_dataplus._M_p = (pointer)&local_9d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9d0,"rap_max","");
  ParameterReader::setVal(&local_1738,&local_9d0,3.7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_9f0._M_dataplus._M_p = (pointer)&local_9f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_9f0,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_1550.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_1550.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_1550.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1550.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1550.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1550.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1550.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_9f0,&local_1550);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_1550.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1550.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p);
  }
  local_a10._M_dataplus._M_p = (pointer)&local_a10.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a10,"rap_min","");
  ParameterReader::setVal(&local_1738,&local_a10,-3.7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10._M_dataplus._M_p != &local_a10.field_2) {
    operator_delete(local_a10._M_dataplus._M_p);
  }
  local_a30._M_dataplus._M_p = (pointer)&local_a30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a30,"rap_max","");
  ParameterReader::setVal(&local_1738,&local_a30,-1.7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a30._M_dataplus._M_p != &local_a30.field_2) {
    operator_delete(local_a30._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_a50._M_dataplus._M_p = (pointer)&local_a50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a50,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_1560.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_1560.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_1560.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1560.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1560.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1560.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1560.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_a50,&local_1560);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_1560.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1560.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a50._M_dataplus._M_p != &local_a50.field_2) {
    operator_delete(local_a50._M_dataplus._M_p);
  }
  local_a70._M_dataplus._M_p = (pointer)&local_a70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a70,"vn_rapidity_dis_pT_min","");
  ParameterReader::setVal(&local_1738,&local_a70,0.2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
    operator_delete(local_a70._M_dataplus._M_p);
  }
  local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a90,"vn_rapidity_dis_pT_max","");
  ParameterReader::setVal(&local_1738,&local_a90,2.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
    operator_delete(local_a90._M_dataplus._M_p);
  }
  local_ab0._M_dataplus._M_p = (pointer)&local_ab0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ab0,"rap_min","");
  ParameterReader::setVal(&local_1738,&local_ab0,-3.9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ab0._M_dataplus._M_p != &local_ab0.field_2) {
    operator_delete(local_ab0._M_dataplus._M_p);
  }
  local_ad0._M_dataplus._M_p = (pointer)&local_ad0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"rap_max","");
  ParameterReader::setVal(&local_1738,&local_ad0,-3.1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ad0._M_dataplus._M_p != &local_ad0.field_2) {
    operator_delete(local_ad0._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_af0._M_dataplus._M_p = (pointer)&local_af0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_af0,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_1570.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_1570.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_1570.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1570.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1570.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1570.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1570.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_af0,&local_1570);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_1570.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1570.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_af0._M_dataplus._M_p != &local_af0.field_2) {
    operator_delete(local_af0._M_dataplus._M_p);
  }
  local_b10._M_dataplus._M_p = (pointer)&local_b10.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b10,"rap_min","");
  ParameterReader::setVal(&local_1738,&local_b10,3.1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b10._M_dataplus._M_p != &local_b10.field_2) {
    operator_delete(local_b10._M_dataplus._M_p);
  }
  local_b30._M_dataplus._M_p = (pointer)&local_b30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b30,"rap_max","");
  ParameterReader::setVal(&local_1738,&local_b30,3.9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b30._M_dataplus._M_p != &local_b30.field_2) {
    operator_delete(local_b30._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_b50._M_dataplus._M_p = (pointer)&local_b50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b50,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_1580.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_1580.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_1580.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1580.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1580.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1580.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1580.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_b50,&local_1580);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_1580.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1580.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b50._M_dataplus._M_p != &local_b50.field_2) {
    operator_delete(local_b50._M_dataplus._M_p);
  }
  local_b70._M_dataplus._M_p = (pointer)&local_b70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b70,"rap_type","");
  ParameterReader::setVal(&local_1738,&local_b70,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b70._M_dataplus._M_p != &local_b70.field_2) {
    operator_delete(local_b70._M_dataplus._M_p);
  }
  local_b90._M_dataplus._M_p = (pointer)&local_b90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b90,"rapidity_distribution","");
  ParameterReader::setVal(&local_1738,&local_b90,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b90._M_dataplus._M_p != &local_b90.field_2) {
    operator_delete(local_b90._M_dataplus._M_p);
  }
  local_bb0._M_dataplus._M_p = (pointer)&local_bb0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bb0,"vn_rapidity_dis_pT_min","");
  ParameterReader::setVal(&local_1738,&local_bb0,0.2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bb0._M_dataplus._M_p != &local_bb0.field_2) {
    operator_delete(local_bb0._M_dataplus._M_p);
  }
  local_bd0._M_dataplus._M_p = (pointer)&local_bd0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bd0,"vn_rapidity_dis_pT_max","");
  ParameterReader::setVal(&local_1738,&local_bd0,3.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bd0._M_dataplus._M_p != &local_bd0.field_2) {
    operator_delete(local_bd0._M_dataplus._M_p);
  }
  local_bf0._M_dataplus._M_p = (pointer)&local_bf0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bf0,"rap_min","");
  ParameterReader::setVal(&local_1738,&local_bf0,-0.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf0._M_dataplus._M_p != &local_bf0.field_2) {
    operator_delete(local_bf0._M_dataplus._M_p);
  }
  local_c10._M_dataplus._M_p = (pointer)&local_c10.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c10,"rap_max","");
  ParameterReader::setVal(&local_1738,&local_c10,0.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c10._M_dataplus._M_p != &local_c10.field_2) {
    operator_delete(local_c10._M_dataplus._M_p);
  }
  local_c30._M_dataplus._M_p = (pointer)&local_c30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c30,"particle_monval","");
  ParameterReader::setVal(&local_1738,&local_c30,211.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c30._M_dataplus._M_p != &local_c30.field_2) {
    operator_delete(local_c30._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_c50._M_dataplus._M_p = (pointer)&local_c50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c50,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_1590.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_1590.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_1590.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1590.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1590.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1590.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1590.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_c50,&local_1590);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_1590.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1590.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c50._M_dataplus._M_p != &local_c50.field_2) {
    operator_delete(local_c50._M_dataplus._M_p);
  }
  local_c70._M_dataplus._M_p = (pointer)&local_c70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c70,"particle_monval","");
  ParameterReader::setVal(&local_1738,&local_c70,-211.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c70._M_dataplus._M_p != &local_c70.field_2) {
    operator_delete(local_c70._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_c90._M_dataplus._M_p = (pointer)&local_c90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c90,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_15a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_15a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_15a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_15a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_15a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_15a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_15a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_c90,&local_15a0);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_15a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_15a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c90._M_dataplus._M_p != &local_c90.field_2) {
    operator_delete(local_c90._M_dataplus._M_p);
  }
  local_cb0._M_dataplus._M_p = (pointer)&local_cb0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cb0,"particle_monval","");
  ParameterReader::setVal(&local_1738,&local_cb0,321.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cb0._M_dataplus._M_p != &local_cb0.field_2) {
    operator_delete(local_cb0._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_cd0._M_dataplus._M_p = (pointer)&local_cd0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_cd0,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_15b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_15b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_15b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_15b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_15b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_15b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_15b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_cd0,&local_15b0);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_15b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_15b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd0._M_dataplus._M_p != &local_cd0.field_2) {
    operator_delete(local_cd0._M_dataplus._M_p);
  }
  local_cf0._M_dataplus._M_p = (pointer)&local_cf0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cf0,"particle_monval","");
  ParameterReader::setVal(&local_1738,&local_cf0,-321.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cf0._M_dataplus._M_p != &local_cf0.field_2) {
    operator_delete(local_cf0._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_d10._M_dataplus._M_p = (pointer)&local_d10.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d10,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_15c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_15c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_15c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_15c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_15c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_15c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_15c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_d10,&local_15c0);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_15c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_15c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d10._M_dataplus._M_p != &local_d10.field_2) {
    operator_delete(local_d10._M_dataplus._M_p);
  }
  local_d30._M_dataplus._M_p = (pointer)&local_d30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d30,"particle_monval","");
  ParameterReader::setVal(&local_1738,&local_d30,2212.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d30._M_dataplus._M_p != &local_d30.field_2) {
    operator_delete(local_d30._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_d50._M_dataplus._M_p = (pointer)&local_d50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d50,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_15d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_15d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_15d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_15d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_15d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_15d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_15d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_d50,&local_15d0);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_15d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_15d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d50._M_dataplus._M_p != &local_d50.field_2) {
    operator_delete(local_d50._M_dataplus._M_p);
  }
  local_d70._M_dataplus._M_p = (pointer)&local_d70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d70,"particle_monval","");
  ParameterReader::setVal(&local_1738,&local_d70,-2212.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d70._M_dataplus._M_p != &local_d70.field_2) {
    operator_delete(local_d70._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_d90._M_dataplus._M_p = (pointer)&local_d90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d90,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_15e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_15e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_15e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_15e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_15e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_15e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_15e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_d90,&local_15e0);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_15e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_15e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d90._M_dataplus._M_p != &local_d90.field_2) {
    operator_delete(local_d90._M_dataplus._M_p);
  }
  local_db0._M_dataplus._M_p = (pointer)&local_db0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_db0,"resonance_weak_feed_down_flag","");
  dVar4 = ParameterReader::getVal(&local_1738,&local_db0);
  uVar11 = SUB84(dVar4,0);
  uVar12 = (undefined4)((ulong)dVar4 >> 0x20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_db0._M_dataplus._M_p != &local_db0.field_2) {
    local_1708 = (ostream *)dVar4;
    operator_delete(local_db0._M_dataplus._M_p);
    uVar11 = SUB84(local_1708,0);
    uVar12 = (undefined4)((ulong)local_1708 >> 0x20);
  }
  if (((double)CONCAT44(uVar12,uVar11) == 0.0) && (!NAN((double)CONCAT44(uVar12,uVar11)))) {
    local_dd0._M_dataplus._M_p = (pointer)&local_dd0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_dd0,"particle_monval","");
    ParameterReader::setVal(&local_1738,&local_dd0,3122.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_dd0._M_dataplus._M_p != &local_dd0.field_2) {
      operator_delete(local_dd0._M_dataplus._M_p);
    }
    psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_df0._M_dataplus._M_p = (pointer)&local_df0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_df0,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_15f0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_15f0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    if (local_15f0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_15f0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_15f0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_15f0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_15f0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_df0,&local_15f0);
    local_1760 = psVar7;
    if (iStack_1750._M_current == local_1748) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)
                 &local_1758,iStack_1750,&local_1760);
    }
    else {
      *iStack_1750._M_current = psVar7;
      iStack_1750._M_current = iStack_1750._M_current + 1;
    }
    if (local_15f0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_15f0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_df0._M_dataplus._M_p != &local_df0.field_2) {
      operator_delete(local_df0._M_dataplus._M_p);
    }
    local_e10._M_dataplus._M_p = (pointer)&local_e10.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e10,"particle_monval","");
    ParameterReader::setVal(&local_1738,&local_e10,-3122.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e10._M_dataplus._M_p != &local_e10.field_2) {
      operator_delete(local_e10._M_dataplus._M_p);
    }
    psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_e30._M_dataplus._M_p = (pointer)&local_e30.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e30,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_1600.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_1600.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    if (local_1600.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1600.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1600.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1600.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1600.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_e30,&local_1600);
    local_1760 = psVar7;
    if (iStack_1750._M_current == local_1748) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)
                 &local_1758,iStack_1750,&local_1760);
    }
    else {
      *iStack_1750._M_current = psVar7;
      iStack_1750._M_current = iStack_1750._M_current + 1;
    }
    if (local_1600.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1600.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e30._M_dataplus._M_p != &local_e30.field_2) {
      operator_delete(local_e30._M_dataplus._M_p);
    }
    local_e50._M_dataplus._M_p = (pointer)&local_e50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e50,"particle_monval","");
    ParameterReader::setVal(&local_1738,&local_e50,3312.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e50._M_dataplus._M_p != &local_e50.field_2) {
      operator_delete(local_e50._M_dataplus._M_p);
    }
    psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_e70._M_dataplus._M_p = (pointer)&local_e70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e70,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_1610.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_1610.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    if (local_1610.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1610.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1610.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1610.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1610.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_e70,&local_1610);
    local_1760 = psVar7;
    if (iStack_1750._M_current == local_1748) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)
                 &local_1758,iStack_1750,&local_1760);
    }
    else {
      *iStack_1750._M_current = psVar7;
      iStack_1750._M_current = iStack_1750._M_current + 1;
    }
    if (local_1610.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1610.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e70._M_dataplus._M_p != &local_e70.field_2) {
      operator_delete(local_e70._M_dataplus._M_p);
    }
    local_e90._M_dataplus._M_p = (pointer)&local_e90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e90,"particle_monval","");
    ParameterReader::setVal(&local_1738,&local_e90,-3312.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e90._M_dataplus._M_p != &local_e90.field_2) {
      operator_delete(local_e90._M_dataplus._M_p);
    }
    psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_eb0._M_dataplus._M_p = (pointer)&local_eb0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_eb0,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_1620.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_1620.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    if (local_1620.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1620.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1620.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1620.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1620.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_eb0,&local_1620);
    local_1760 = psVar7;
    if (iStack_1750._M_current == local_1748) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)
                 &local_1758,iStack_1750,&local_1760);
    }
    else {
      *iStack_1750._M_current = psVar7;
      iStack_1750._M_current = iStack_1750._M_current + 1;
    }
    if (local_1620.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1620.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_eb0._M_dataplus._M_p != &local_eb0.field_2) {
      operator_delete(local_eb0._M_dataplus._M_p);
    }
    local_ed0._M_dataplus._M_p = (pointer)&local_ed0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ed0,"particle_monval","");
    ParameterReader::setVal(&local_1738,&local_ed0,3334.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ed0._M_dataplus._M_p != &local_ed0.field_2) {
      operator_delete(local_ed0._M_dataplus._M_p);
    }
    psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_ef0._M_dataplus._M_p = (pointer)&local_ef0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_ef0,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_1630.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_1630.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    if (local_1630.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1630.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1630.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1630.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1630.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_ef0,&local_1630);
    local_1760 = psVar7;
    if (iStack_1750._M_current == local_1748) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)
                 &local_1758,iStack_1750,&local_1760);
    }
    else {
      *iStack_1750._M_current = psVar7;
      iStack_1750._M_current = iStack_1750._M_current + 1;
    }
    if (local_1630.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1630.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ef0._M_dataplus._M_p != &local_ef0.field_2) {
      operator_delete(local_ef0._M_dataplus._M_p);
    }
    local_f10._M_dataplus._M_p = (pointer)&local_f10.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f10,"particle_monval","");
    ParameterReader::setVal(&local_1738,&local_f10,-3334.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f10._M_dataplus._M_p != &local_f10.field_2) {
      operator_delete(local_f10._M_dataplus._M_p);
    }
    psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_f30._M_dataplus._M_p = (pointer)&local_f30.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f30,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_1640.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_1640.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    if (local_1640.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1640.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1640.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1640.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1640.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_f30,&local_1640);
    local_1760 = psVar7;
    if (iStack_1750._M_current == local_1748) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)
                 &local_1758,iStack_1750,&local_1760);
    }
    else {
      *iStack_1750._M_current = psVar7;
      iStack_1750._M_current = iStack_1750._M_current + 1;
    }
    if (local_1640.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1640.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f30._M_dataplus._M_p != &local_f30.field_2) {
      operator_delete(local_f30._M_dataplus._M_p);
    }
    local_f50._M_dataplus._M_p = (pointer)&local_f50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f50,"particle_monval","");
    ParameterReader::setVal(&local_1738,&local_f50,333.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f50._M_dataplus._M_p != &local_f50.field_2) {
      operator_delete(local_f50._M_dataplus._M_p);
    }
    psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_f70._M_dataplus._M_p = (pointer)&local_f70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f70,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_1650.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_1650.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    if (local_1650.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1650.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1650.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1650.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1650.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_f70,&local_1650);
    local_1760 = psVar7;
    if (iStack_1750._M_current == local_1748) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)
                 &local_1758,iStack_1750,&local_1760);
    }
    else {
      *iStack_1750._M_current = psVar7;
      iStack_1750._M_current = iStack_1750._M_current + 1;
    }
    if (local_1650.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1650.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f70._M_dataplus._M_p != &local_f70.field_2) {
      operator_delete(local_f70._M_dataplus._M_p);
    }
  }
  local_f90._M_dataplus._M_p = (pointer)&local_f90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f90,"collect_neutral_particles","");
  dVar4 = ParameterReader::getVal(&local_1738,&local_f90,0.0);
  uVar11 = SUB84(dVar4,0);
  uVar12 = (undefined4)((ulong)dVar4 >> 0x20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f90._M_dataplus._M_p != &local_f90.field_2) {
    local_1708 = (ostream *)dVar4;
    operator_delete(local_f90._M_dataplus._M_p);
    uVar11 = SUB84(local_1708,0);
    uVar12 = (undefined4)((ulong)local_1708 >> 0x20);
  }
  if (((double)CONCAT44(uVar12,uVar11) == 1.0) && (!NAN((double)CONCAT44(uVar12,uVar11)))) {
    local_fb0._M_dataplus._M_p = (pointer)&local_fb0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_fb0,"particle_monval","");
    ParameterReader::setVal(&local_1738,&local_fb0,111.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_fb0._M_dataplus._M_p != &local_fb0.field_2) {
      operator_delete(local_fb0._M_dataplus._M_p);
    }
    psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_fd0._M_dataplus._M_p = (pointer)&local_fd0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_fd0,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_1660.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_1660.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    if (local_1660.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1660.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1660.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1660.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1660.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_fd0,&local_1660);
    local_1760 = psVar7;
    if (iStack_1750._M_current == local_1748) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)
                 &local_1758,iStack_1750,&local_1760);
    }
    else {
      *iStack_1750._M_current = psVar7;
      iStack_1750._M_current = iStack_1750._M_current + 1;
    }
    if (local_1660.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1660.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_fd0._M_dataplus._M_p != &local_fd0.field_2) {
      operator_delete(local_fd0._M_dataplus._M_p);
    }
    local_ff0._M_dataplus._M_p = (pointer)&local_ff0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ff0,"particle_monval","");
    ParameterReader::setVal(&local_1738,&local_ff0,311.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ff0._M_dataplus._M_p != &local_ff0.field_2) {
      operator_delete(local_ff0._M_dataplus._M_p);
    }
    psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_1010._M_dataplus._M_p = (pointer)&local_1010.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1010,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_1670.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_1670.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    if (local_1670.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1670.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1670.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1670.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1670.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_1010,&local_1670);
    local_1760 = psVar7;
    if (iStack_1750._M_current == local_1748) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)
                 &local_1758,iStack_1750,&local_1760);
    }
    else {
      *iStack_1750._M_current = psVar7;
      iStack_1750._M_current = iStack_1750._M_current + 1;
    }
    if (local_1670.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1670.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1010._M_dataplus._M_p != &local_1010.field_2) {
      operator_delete(local_1010._M_dataplus._M_p);
    }
    local_1030._M_dataplus._M_p = (pointer)&local_1030.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1030,"particle_monval","");
    ParameterReader::setVal(&local_1738,&local_1030,-311.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1030._M_dataplus._M_p != &local_1030.field_2) {
      operator_delete(local_1030._M_dataplus._M_p);
    }
    psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_1050._M_dataplus._M_p = (pointer)&local_1050.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1050,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_1680.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_1680.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    if (local_1680.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1680.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1680.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1680.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1680.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_1050,&local_1680);
    local_1760 = psVar7;
    if (iStack_1750._M_current == local_1748) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)
                 &local_1758,iStack_1750,&local_1760);
    }
    else {
      *iStack_1750._M_current = psVar7;
      iStack_1750._M_current = iStack_1750._M_current + 1;
    }
    if (local_1680.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1680.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1050._M_dataplus._M_p != &local_1050.field_2) {
      operator_delete(local_1050._M_dataplus._M_p);
    }
    local_1070._M_dataplus._M_p = (pointer)&local_1070.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1070,"particle_monval","");
    ParameterReader::setVal(&local_1738,&local_1070,2112.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1070._M_dataplus._M_p != &local_1070.field_2) {
      operator_delete(local_1070._M_dataplus._M_p);
    }
    psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_1090._M_dataplus._M_p = (pointer)&local_1090.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1090,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_1690.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_1690.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    if (local_1690.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1690.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1690.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1690.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1690.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_1090,&local_1690);
    local_1760 = psVar7;
    if (iStack_1750._M_current == local_1748) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)
                 &local_1758,iStack_1750,&local_1760);
    }
    else {
      *iStack_1750._M_current = psVar7;
      iStack_1750._M_current = iStack_1750._M_current + 1;
    }
    if (local_1690.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1690.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1090._M_dataplus._M_p != &local_1090.field_2) {
      operator_delete(local_1090._M_dataplus._M_p);
    }
    local_10b0._M_dataplus._M_p = (pointer)&local_10b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_10b0,"particle_monval","");
    ParameterReader::setVal(&local_1738,&local_10b0,-2112.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_10b0._M_dataplus._M_p != &local_10b0.field_2) {
      operator_delete(local_10b0._M_dataplus._M_p);
    }
    psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_10d0._M_dataplus._M_p = (pointer)&local_10d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_10d0,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_16a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_16a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    if (local_16a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_16a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_16a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_16a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_16a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_10d0,&local_16a0);
    local_1760 = psVar7;
    if (iStack_1750._M_current == local_1748) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)
                 &local_1758,iStack_1750,&local_1760);
    }
    else {
      *iStack_1750._M_current = psVar7;
      iStack_1750._M_current = iStack_1750._M_current + 1;
    }
    if (local_16a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_16a0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_10d0._M_dataplus._M_p != &local_10d0.field_2) {
      operator_delete(local_10d0._M_dataplus._M_p);
    }
  }
  local_10f0._M_dataplus._M_p = (pointer)&local_10f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_10f0,"rap_type","");
  ParameterReader::setVal(&local_1738,&local_10f0,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10f0._M_dataplus._M_p != &local_10f0.field_2) {
    operator_delete(local_10f0._M_dataplus._M_p);
  }
  local_1110._M_dataplus._M_p = (pointer)&local_1110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1110,"particle_monval","");
  ParameterReader::setVal(&local_1738,&local_1110,2212.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1110._M_dataplus._M_p != &local_1110.field_2) {
    operator_delete(local_1110._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_1130._M_dataplus._M_p = (pointer)&local_1130.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1130,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_16b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_16b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_16b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_16b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_16b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_16b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_16b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_1130,&local_16b0);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_16b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_16b0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1130._M_dataplus._M_p != &local_1130.field_2) {
    operator_delete(local_1130._M_dataplus._M_p);
  }
  local_1150._M_dataplus._M_p = (pointer)&local_1150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1150,"particle_monval","");
  ParameterReader::setVal(&local_1738,&local_1150,-2212.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1150._M_dataplus._M_p != &local_1150.field_2) {
    operator_delete(local_1150._M_dataplus._M_p);
  }
  psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_1170._M_dataplus._M_p = (pointer)&local_1170.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1170,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_16c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_16c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_16c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_16c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_16c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_16c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_16c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_1170,&local_16c0);
  local_1760 = psVar7;
  if (iStack_1750._M_current == local_1748) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_1758,
               iStack_1750,&local_1760);
  }
  else {
    *iStack_1750._M_current = psVar7;
    iStack_1750._M_current = iStack_1750._M_current + 1;
  }
  if (local_16c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_16c0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1170._M_dataplus._M_p != &local_1170.field_2) {
    operator_delete(local_1170._M_dataplus._M_p);
  }
  if ((int)dVar2 == 1) {
    local_1190._M_dataplus._M_p = (pointer)&local_1190.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1190,"compute_correlation","");
    ParameterReader::setVal(&local_1738,&local_1190,1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1190._M_dataplus._M_p != &local_1190.field_2) {
      operator_delete(local_1190._M_dataplus._M_p);
    }
    local_11b0._M_dataplus._M_p = (pointer)&local_11b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_11b0,"flag_charge_dependence","");
    ParameterReader::setVal(&local_1738,&local_11b0,(double)(int)dVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_11b0._M_dataplus._M_p != &local_11b0.field_2) {
      operator_delete(local_11b0._M_dataplus._M_p);
    }
    local_11d0._M_dataplus._M_p = (pointer)&local_11d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_11d0,"particle_monval","");
    ParameterReader::setVal(&local_1738,&local_11d0,9999.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_11d0._M_dataplus._M_p != &local_11d0.field_2) {
      operator_delete(local_11d0._M_dataplus._M_p);
    }
    local_11f0._M_dataplus._M_p = (pointer)&local_11f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_11f0,"rap_type","");
    ParameterReader::setVal(&local_1738,&local_11f0,0.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_11f0._M_dataplus._M_p != &local_11f0.field_2) {
      operator_delete(local_11f0._M_dataplus._M_p);
    }
    local_1210._M_dataplus._M_p = (pointer)&local_1210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1210,"compute_corr_rap_dep","")
    ;
    dVar2 = ParameterReader::getVal(&local_1738,&local_1210);
    uVar11 = SUB84(dVar2,0);
    uVar12 = (undefined4)((ulong)dVar2 >> 0x20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1210._M_dataplus._M_p != &local_1210.field_2) {
      local_1708 = (ostream *)dVar2;
      operator_delete(local_1210._M_dataplus._M_p);
      uVar11 = SUB84(local_1708,0);
      uVar12 = (undefined4)((ulong)local_1708 >> 0x20);
    }
    if (((double)CONCAT44(uVar12,uVar11) != 1.0) || (NAN((double)CONCAT44(uVar12,uVar11)))) {
      paVar10 = &local_12b0.field_2;
      local_12b0._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_12b0,"rapidity_distribution","");
      ParameterReader::setVal(&local_1738,&local_12b0,0.0);
      _Var9._M_p = local_12b0._M_dataplus._M_p;
    }
    else {
      local_1230._M_dataplus._M_p = (pointer)&local_1230.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1230,"rapidity_distribution","");
      ParameterReader::setVal(&local_1738,&local_1230,1.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1230._M_dataplus._M_p != &local_1230.field_2) {
        operator_delete(local_1230._M_dataplus._M_p);
      }
      local_1250._M_dataplus._M_p = (pointer)&local_1250.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1250,"rapidity_dis_min","");
      ParameterReader::setVal(&local_1738,&local_1250,-2.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1250._M_dataplus._M_p != &local_1250.field_2) {
        operator_delete(local_1250._M_dataplus._M_p);
      }
      local_1270._M_dataplus._M_p = (pointer)&local_1270.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1270,"rapidity_dis_max","");
      ParameterReader::setVal(&local_1738,&local_1270,2.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1270._M_dataplus._M_p != &local_1270.field_2) {
        operator_delete(local_1270._M_dataplus._M_p);
      }
      paVar10 = &local_1290.field_2;
      local_1290._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1290,"n_rap","");
      ParameterReader::setVal(&local_1738,&local_1290,41.0);
      _Var9._M_p = local_1290._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var9._M_p != paVar10) {
      operator_delete(_Var9._M_p);
    }
    local_12d0._M_dataplus._M_p = (pointer)&local_12d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_12d0,"vn_rapidity_dis_pT_min","");
    ParameterReader::setVal(&local_1738,&local_12d0,0.2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_12d0._M_dataplus._M_p != &local_12d0.field_2) {
      operator_delete(local_12d0._M_dataplus._M_p);
    }
    local_12f0._M_dataplus._M_p = (pointer)&local_12f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_12f0,"vn_rapidity_dis_pT_max","");
    ParameterReader::setVal(&local_1738,&local_12f0,2.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_12f0._M_dataplus._M_p != &local_12f0.field_2) {
      operator_delete(local_12f0._M_dataplus._M_p);
    }
    local_1310._M_dataplus._M_p = (pointer)&local_1310.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1310,"rap_min","");
    ParameterReader::setVal(&local_1738,&local_1310,-1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1310._M_dataplus._M_p != &local_1310.field_2) {
      operator_delete(local_1310._M_dataplus._M_p);
    }
    local_1330._M_dataplus._M_p = (pointer)&local_1330.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1330,"rap_max","");
    ParameterReader::setVal(&local_1738,&local_1330,1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1330._M_dataplus._M_p != &local_1330.field_2) {
      operator_delete(local_1330._M_dataplus._M_p);
    }
    psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_1350._M_dataplus._M_p = (pointer)&local_1350.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1350,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_16d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_16d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    if (local_16d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_16d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_16d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_16d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_16d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_1350,&local_16d0);
    local_1760 = psVar7;
    if (iStack_1750._M_current == local_1748) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)
                 &local_1758,iStack_1750,&local_1760);
    }
    else {
      *iStack_1750._M_current = psVar7;
      iStack_1750._M_current = iStack_1750._M_current + 1;
    }
    if (local_16d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_16d0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1350._M_dataplus._M_p != &local_1350.field_2) {
      operator_delete(local_1350._M_dataplus._M_p);
    }
    local_1370._M_dataplus._M_p = (pointer)&local_1370.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1370,"rap_min","");
    ParameterReader::setVal(&local_1738,&local_1370,-2.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1370._M_dataplus._M_p != &local_1370.field_2) {
      operator_delete(local_1370._M_dataplus._M_p);
    }
    local_1390._M_dataplus._M_p = (pointer)&local_1390.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1390,"rap_max","");
    ParameterReader::setVal(&local_1738,&local_1390,2.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1390._M_dataplus._M_p != &local_1390.field_2) {
      operator_delete(local_1390._M_dataplus._M_p);
    }
    psVar7 = (singleParticleSpectra *)operator_new(0x8b8);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_13b0._M_dataplus._M_p = (pointer)&local_13b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_13b0,pcVar1,pcVar1 + (this->path_)._M_string_length);
    local_16e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_16e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    if (local_16e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_16e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_16e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_16e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_16e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    singleParticleSpectra::singleParticleSpectra(psVar7,&local_1738,&local_13b0,&local_16e0);
    local_1760 = psVar7;
    if (iStack_1750._M_current == local_1748) {
      std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
      _M_realloc_insert<singleParticleSpectra*>
                ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)
                 &local_1758,iStack_1750,&local_1760);
    }
    else {
      *iStack_1750._M_current = psVar7;
      iStack_1750._M_current = iStack_1750._M_current + 1;
    }
    if (local_16e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_16e0.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13b0._M_dataplus._M_p != &local_13b0.field_2) {
      operator_delete(local_13b0._M_dataplus._M_p);
    }
  }
  local_1708 = (ostream *)&this->messager;
  local_16f8 = 0;
  while( true ) {
    this_00 = local_1708;
    bVar6 = particleSamples::end_of_file
                      ((this->particle_list_).
                       super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    iVar5._M_current = iStack_1750._M_current;
    if (bVar6) break;
    std::__ostream_insert<char,std::char_traits<char>>(this_00,"Reading event: ",0xf);
    std::ostream::operator<<(this_00,(int)local_16f8 + 1);
    std::__ostream_insert<char,std::char_traits<char>>(this_00," ... ",5);
    local_13f0._M_dataplus._M_p = (pointer)&local_13f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_13f0,"info","");
    pretty_ostream::flush((pretty_ostream *)this_00,&local_13f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13f0._M_dataplus._M_p != &local_13f0.field_2) {
      operator_delete(local_13f0._M_dataplus._M_p);
    }
    local_16fc = particleSamples::read_in_particle_samples
                           ((this->particle_list_).
                            super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__ostream_insert<char,std::char_traits<char>>(local_1708,"nev = ",6);
    std::ostream::operator<<(local_1708,local_16fc);
    local_1410._M_dataplus._M_p = (pointer)&local_1410.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1410,"info","");
    pretty_ostream::flush((pretty_ostream *)local_1708,&local_1410);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1410._M_dataplus._M_p != &local_1410.field_2) {
      operator_delete(local_1410._M_dataplus._M_p);
    }
    local_13d0._M_dataplus._M_p = (pointer)&local_13d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_13d0," processing ...","");
    pretty_ostream::info((pretty_ostream *)local_1708,&local_13d0);
    ppsVar8 = local_1758;
    iVar5._M_current = iStack_1750._M_current;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13d0._M_dataplus._M_p != &local_13d0.field_2) {
      operator_delete(local_13d0._M_dataplus._M_p);
      ppsVar8 = local_1758;
      iVar5._M_current = iStack_1750._M_current;
    }
    for (; ppsVar8 != iVar5._M_current; ppsVar8 = ppsVar8 + 1) {
      particleSamples::filter_particles_from_events
                ((this->particle_list_).
                 super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (*ppsVar8)->particle_monval);
      psVar7 = *ppsVar8;
      local_16f0.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this->particle_list_).super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_16f0.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (this->particle_list_).super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_16f0.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_16f0.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_16f0.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_16f0.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_16f0.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      singleParticleSpectra::calculate_Qn_vector_shell(psVar7,&local_16f0);
      if (local_16f0.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_16f0.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    local_1430._M_dataplus._M_p = (pointer)&local_1430.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1430,"done!","");
    pretty_ostream::info((pretty_ostream *)local_1708,&local_1430);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1430._M_dataplus._M_p != &local_1430.field_2) {
      operator_delete(local_1430._M_dataplus._M_p);
    }
    local_16f8 = (ulong)(uint)(local_16fc + (int)local_16f8);
  }
  ppsVar8 = local_1758;
  if (local_1758 != iStack_1750._M_current) {
    do {
      singleParticleSpectra::output_spectra_and_Qn_results(*ppsVar8);
      ppsVar8 = ppsVar8 + 1;
    } while (ppsVar8 != iVar5._M_current);
    if (iStack_1750._M_current != local_1758) {
      iStack_1750._M_current = local_1758;
    }
  }
  if (local_1758 != (singleParticleSpectra **)0x0) {
    operator_delete(local_1758);
  }
  ParameterReader::~ParameterReader(&local_1738);
  return;
}

Assistant:

void Analysis::FlowAnalysis() {
    ParameterReader paraRdr = paraRdr_;
    int compute_correlation = paraRdr.getVal("compute_correlation");
    if (compute_correlation == 1) paraRdr.setVal("compute_correlation", 0);
    int flag_charge_dependence = paraRdr.getVal("flag_charge_dependence");
    if (flag_charge_dependence == 1)
        paraRdr.setVal("flag_charge_dependence", 0);

    // first define all the analysis sets
    std::vector<singleParticleSpectra *> spvn;

    // all hadrons (99999) first (collect E_T)
    paraRdr.setVal("particle_monval", 99999);
    paraRdr.setVal("rap_type", 0);
    paraRdr.setVal("rapidity_distribution", 1);
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 4.);
    paraRdr.setVal("rapidityPTDistributionFlag", 1);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));

    // charged hadron first
    paraRdr.setVal("particle_monval", 9999);
    paraRdr.setVal("rap_type", 0);
    paraRdr.setVal("rapidity_distribution", 1);
    paraRdr.setVal("rapidityPTDistributionFlag", 0);
    paraRdr.setVal("rap_min", -0.5);
    paraRdr.setVal("rap_max", 0.5);
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.15);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 2.0);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.2);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 3.0);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // STAR rapidity cut
    paraRdr.setVal("rap_min", -1.0);
    paraRdr.setVal("rap_max", -0.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", 0.5);
    paraRdr.setVal("rap_max", 1.0);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", -1.0);
    paraRdr.setVal("rap_max", 1.0);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // ALICE rapidity cut
    paraRdr.setVal("rap_min", -0.8);
    paraRdr.setVal("rap_max", 0.8);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // STAR flow rapidity decorrelation cut
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.4);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 4.0);
    paraRdr.setVal("rap_min", -1.0);
    paraRdr.setVal("rap_max", 1.0);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // CMS default cut
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.3);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 3.0);
    paraRdr.setVal("rap_min", -2.4);
    paraRdr.setVal("rap_max", 2.4);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // ATLAS UPC cut
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.4);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 2.0);
    paraRdr.setVal("rap_min", -2.5);
    paraRdr.setVal("rap_max", 2.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // ATLAS default cut
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.5);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 5.0);
    paraRdr.setVal("rap_min", -2.5);
    paraRdr.setVal("rap_max", 2.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", 0.5);
    paraRdr.setVal("rap_max", 2.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", -2.5);
    paraRdr.setVal("rap_max", -0.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // ATLAS forward
    paraRdr.setVal("rap_min", -4.9);
    paraRdr.setVal("rap_max", -3.1);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", 3.1);
    paraRdr.setVal("rap_max", 4.9);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // ALICE V0A
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.2);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 3.0);
    paraRdr.setVal("rap_min", -5.1);
    paraRdr.setVal("rap_max", -2.8);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", 2.8);
    paraRdr.setVal("rap_max", 5.1);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // ALICE V0C
    paraRdr.setVal("rap_min", 1.7);
    paraRdr.setVal("rap_max", 3.7);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", -3.7);
    paraRdr.setVal("rap_max", -1.7);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // PHENIX BBC
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.2);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 2.0);
    paraRdr.setVal("rap_min", -3.9);
    paraRdr.setVal("rap_max", -3.1);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", 3.1);
    paraRdr.setVal("rap_max", 3.9);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));

    // now identified particle
    paraRdr.setVal("rap_type", 1);
    paraRdr.setVal("rapidity_distribution", 1);
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.2);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 3.0);
    paraRdr.setVal("rap_min", -0.5);
    paraRdr.setVal("rap_max", 0.5);
    paraRdr.setVal("particle_monval", 211);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -211);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", 321);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -321);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", 2212);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -2212);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    if (paraRdr.getVal("resonance_weak_feed_down_flag") == 0) {
        paraRdr.setVal("particle_monval", 3122);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -3122);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 3312);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -3312);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 3334);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -3334);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 333);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    }
    if (paraRdr.getVal("collect_neutral_particles", 0) == 1) {
        paraRdr.setVal("particle_monval", 111);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 311);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -311);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 2112);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -2112);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    }
    paraRdr.setVal("rap_type", 0);
    paraRdr.setVal("particle_monval", 2212);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -2212);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));

    // lastly, if we want to compute multi-particle correlations within
    // the same UrQMD events
    if (compute_correlation == 1) {
        paraRdr.setVal("compute_correlation", 1);
        paraRdr.setVal("flag_charge_dependence", flag_charge_dependence);
        paraRdr.setVal("particle_monval", 9999);
        paraRdr.setVal("rap_type", 0);
        if (paraRdr.getVal("compute_corr_rap_dep") == 1) {
            // turn on flag to compute the rapidity dependent muti-particle
            // correlations
            paraRdr.setVal("rapidity_distribution", 1);
            paraRdr.setVal("rapidity_dis_min", -2.0);
            paraRdr.setVal("rapidity_dis_max", 2.0);
            paraRdr.setVal("n_rap", 41);
        } else {
            paraRdr.setVal("rapidity_distribution", 0);
        }
        paraRdr.setVal("vn_rapidity_dis_pT_min", 0.2);
        paraRdr.setVal("vn_rapidity_dis_pT_max", 2.0);
        paraRdr.setVal("rap_min", -1.0);
        paraRdr.setVal("rap_max", 1.0);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("rap_min", -2.0);
        paraRdr.setVal("rap_max", 2.0);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    }

    // start the loop
    int event_id = 0;
    while (!particle_list_->end_of_file()) {
        messager << "Reading event: " << event_id + 1 << " ... ";
        messager.flush("info");
        int nev = particle_list_->read_in_particle_samples();
        messager << "nev = " << nev;
        messager.flush("info");
        messager.info(" processing ...");
        for (auto &ipart : spvn) {
            int particle_monval = ipart->get_monval();
            particle_list_->filter_particles_from_events(particle_monval);
            ipart->calculate_Qn_vector_shell(particle_list_);
        }
        messager.info("done!");
        event_id += nev;
    }
    for (auto &ipart : spvn) ipart->output_spectra_and_Qn_results();
    spvn.clear();
}